

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O3

void __thiscall
NLReaderTest_ReadNumericConstant_Test::~NLReaderTest_ReadNumericConstant_Test
          (NLReaderTest_ReadNumericConstant_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(NLReaderTest, ReadNumericConstant) {
  EXPECT_READ("c0: 4.2;", "C0\nn4.2\n");
  EXPECT_READ("c0: -100;", "C0\nn-1e+2\n");
  CheckReadInt<short>('s');
  if (sizeof(double) == 2 * sizeof(int))
    CheckReadInt<int>('l');
  else
    CheckReadInt<long>('l');
}